

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

void opj_image_comp_header_update(opj_image_t *p_image_header,opj_cp_v2 *p_cp)

{
  byte bVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  int iVar5;
  OPJ_UINT32 OVar6;
  uint uVar7;
  uint uVar8;
  OPJ_UINT32 OVar9;
  OPJ_UINT32 OVar10;
  opj_image_comp_t *poVar11;
  OPJ_UINT32 OVar12;
  
  OVar9 = p_image_header->numcomps;
  if (OVar9 != 0) {
    poVar11 = p_image_header->comps;
    OVar2 = p_cp->tx0;
    OVar12 = p_cp->ty0;
    OVar10 = p_cp->tdy * p_cp->th + OVar12;
    if ((int)p_image_header->y1 <= (int)OVar10) {
      OVar10 = p_image_header->y1;
    }
    OVar6 = p_cp->tdx * p_cp->tw + OVar2;
    if ((int)p_image_header->x1 <= (int)OVar6) {
      OVar6 = p_image_header->x1;
    }
    OVar4 = p_image_header->y0;
    if ((int)p_image_header->y0 < (int)OVar12) {
      OVar4 = OVar12;
    }
    OVar12 = p_image_header->x0;
    if ((int)p_image_header->x0 < (int)OVar2) {
      OVar12 = OVar2;
    }
    do {
      OVar2 = poVar11->dx;
      OVar3 = poVar11->dy;
      uVar7 = (int)((OVar12 - 1) + OVar2) / (int)OVar2;
      uVar8 = (int)((OVar4 - 1) + OVar3) / (int)OVar3;
      bVar1 = (byte)poVar11->factor;
      iVar5 = 1 << (bVar1 & 0x1f);
      poVar11->w = (int)((int)((OVar6 - 1) + OVar2) / (int)OVar2 + iVar5 + ~uVar7) >> (bVar1 & 0x1f)
      ;
      poVar11->h = (int)(iVar5 + (int)((OVar10 - 1) + OVar3) / (int)OVar3 + ~uVar8) >>
                   (bVar1 & 0x1f);
      poVar11->x0 = uVar7;
      poVar11->y0 = uVar8;
      poVar11 = poVar11 + 1;
      OVar9 = OVar9 - 1;
    } while (OVar9 != 0);
  }
  return;
}

Assistant:

void opj_image_comp_header_update(opj_image_t * p_image_header, const struct opj_cp_v2 * p_cp)
{
	OPJ_UINT32 i, l_width, l_height;
	OPJ_INT32 l_x0, l_y0, l_x1, l_y1;
	OPJ_INT32 l_comp_x0, l_comp_y0, l_comp_x1, l_comp_y1;
	opj_image_comp_t* l_img_comp = NULL;

	l_x0 = int_max(p_cp->tx0 , p_image_header->x0);
	l_y0 = int_max(p_cp->ty0 , p_image_header->y0);
	l_x1 = int_min(p_cp->tx0 + p_cp->tw * p_cp->tdx, p_image_header->x1);
	l_y1 = int_min(p_cp->ty0 + p_cp->th * p_cp->tdy, p_image_header->y1);

	l_img_comp = p_image_header->comps;
	for	(i = 0; i < p_image_header->numcomps; ++i) {
		l_comp_x0 = int_ceildiv(l_x0, l_img_comp->dx);
		l_comp_y0 = int_ceildiv(l_y0, l_img_comp->dy);
		l_comp_x1 = int_ceildiv(l_x1, l_img_comp->dx);
		l_comp_y1 = int_ceildiv(l_y1, l_img_comp->dy);
		l_width = int_ceildivpow2(l_comp_x1 - l_comp_x0, l_img_comp->factor);
		l_height = int_ceildivpow2(l_comp_y1 - l_comp_y0, l_img_comp->factor);
		l_img_comp->w = l_width;
		l_img_comp->h = l_height;
		l_img_comp->x0 = l_comp_x0/*l_x0*/;
		l_img_comp->y0 = l_comp_y0/*l_y0*/;
		++l_img_comp;
	}
}